

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGPolyElement::SVGPolyElement(SVGPolyElement *this,Document *document,ElementID id)

{
  SVGGraphicsElement::SVGGraphicsElement((SVGGraphicsElement *)this,document,id);
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGGeometryElement_001593d0;
  (this->super_SVGGeometryElement).m_path.m_data = (plutovg_path_t *)0x0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.x = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.y = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.w = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.h = 0.0;
  (this->super_SVGGeometryElement).m_strokeData.m_lineWidth = 1.0;
  (this->super_SVGGeometryElement).m_strokeData.m_miterLimit = 4.0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashOffset = 0.0;
  (this->super_SVGGeometryElement).m_strokeData.m_lineCap = Butt;
  (this->super_SVGGeometryElement).m_strokeData.m_lineJoin = Miter;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_SVGGeometryElement).m_fill.m_element = (SVGPaintElement *)0x0;
  (this->super_SVGGeometryElement).m_fill.m_color.m_value = 0;
  (this->super_SVGGeometryElement).m_fill.m_opacity = 0.0;
  (this->super_SVGGeometryElement).m_stroke.m_element = (SVGPaintElement *)0x0;
  (this->super_SVGGeometryElement).m_stroke.m_color.m_value = 0;
  *(undefined8 *)&(this->super_SVGGeometryElement).m_stroke.m_opacity = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGPolyElement_00159718;
  SVGProperty::SVGProperty(&(this->m_points).super_SVGProperty,Points);
  (this->m_points).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGPointList_0015aff0;
  (this->m_points).m_values.super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_points).m_values.super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_points).m_values.super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVGElement::addProperty((SVGElement *)this,&(this->m_points).super_SVGProperty);
  return;
}

Assistant:

SVGPolyElement::SVGPolyElement(Document* document, ElementID id)
    : SVGGeometryElement(document, id)
    , m_points(PropertyID::Points)
{
    addProperty(m_points);
}